

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::addSimpleVertexAndFragmentPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  TextureFormat TVar4;
  char *pcVar5;
  ostream *poVar6;
  ProgramSources *pPVar7;
  char *pcVar8;
  allocator<char> local_229;
  string colorFormat;
  string local_208;
  undefined1 local_1e8 [40];
  string local_1c0;
  ostringstream src;
  
  TVar4 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar3 = tcu::getNumUsedChannels(TVar4.order);
  bVar1 = ::vk::isUintFormat(caseDef->colorFormat);
  bVar2 = ::vk::isIntFormat(caseDef->colorFormat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar6 = std::operator<<((ostream *)&src,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) in  vec4 in_position;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 1) in  vec4 in_color;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out vec4 o_color;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"out gl_PerVertex {\n");
  poVar6 = std::operator<<(poVar6,"    vec4 gl_Position;\n");
  poVar6 = std::operator<<(poVar6,"};\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"    gl_Position = in_position;\n");
  poVar6 = std::operator<<(poVar6,"    o_color     = in_color;\n");
  std::operator<<(poVar6,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colorFormat,"vert",(allocator<char> *)&local_1c0);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&colorFormat);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1e8,&local_208);
  glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_1e8);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&colorFormat);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  if (iVar3 == 1) {
    pcVar5 = "float";
    if (bVar2) {
      pcVar5 = "int";
    }
    pcVar8 = "uint";
    if (!bVar1) {
      pcVar8 = pcVar5;
    }
    std::operator<<((ostream *)&src,pcVar8);
  }
  else {
    pcVar5 = "";
    if (bVar2) {
      pcVar5 = "i";
    }
    pcVar8 = "u";
    if (!bVar1) {
      pcVar8 = pcVar5;
    }
    poVar6 = std::operator<<((ostream *)&src,pcVar8);
    poVar6 = std::operator<<(poVar6,"vec");
    std::ostream::operator<<(poVar6,iVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar6 = std::operator<<((ostream *)&src,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) in  vec4 in_color;\n");
  poVar6 = std::operator<<(poVar6,"layout(location = 0) out ");
  poVar6 = std::operator<<(poVar6,(string *)&colorFormat);
  poVar6 = std::operator<<(poVar6," o_color;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"void main(void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"    o_color = ");
  poVar6 = std::operator<<(poVar6,(string *)&colorFormat);
  poVar6 = std::operator<<(poVar6,"(");
  if (iVar3 == 1) {
    pcVar5 = "in_color.r";
  }
  else if (iVar3 == 2) {
    pcVar5 = "in_color.rg";
  }
  else {
    pcVar5 = "in_color";
    if (iVar3 == 3) {
      pcVar5 = "in_color.rgb";
    }
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,");\n");
  std::operator<<(poVar6,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"frag",&local_229);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_208);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1e8,&local_1c0);
  glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_1e8);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::string::~string((string *)&colorFormat);
  return;
}

Assistant:

void addSimpleVertexAndFragmentPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	const int	numComponents	= tcu::getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
	const bool	isUint			= isUintFormat(caseDef.colorFormat);
	const bool	isSint			= isIntFormat(caseDef.colorFormat);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "    o_color     = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const std::string colorFormat = getColorFormatStr(numComponents, isUint, isSint);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out " << colorFormat << " o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = " << colorFormat << "("		// float color will be converted to int/uint here if needed
			<< (numComponents == 1 ? "in_color.r"   :
				numComponents == 2 ? "in_color.rg"  :
				numComponents == 3 ? "in_color.rgb" : "in_color") << ");\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}